

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_msg_bar4.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uintptr_t uVar2;
  char *pcVar3;
  char *__format;
  in_addr addr;
  
  if (argc < 2) {
    pcVar3 = *argv;
    __format = "usage: %s [NetTLP host addr]\n";
  }
  else {
    iVar1 = inet_pton(2,argv[1],&addr);
    if (0 < iVar1) {
      uVar2 = nettlp_msg_get_bar4_start(addr);
      printf("BAR4 is %#lx\n",uVar2);
      return 0;
    }
    pcVar3 = argv[1];
    __format = "invalid addr %s\n";
  }
  printf(__format,pcVar3);
  return -1;
}

Assistant:

int main(int argc, char **argv)
{
	struct in_addr addr;
	uintptr_t bar4;

	if (argc < 2) {
		printf("usage: %s [NetTLP host addr]\n", argv[0]);
		return -1;
	}

	if (inet_pton(AF_INET, argv[1], &addr) < 1) {
		printf("invalid addr %s\n", argv[1]);
		return -1;
	}

	bar4 = nettlp_msg_get_bar4_start(addr);
	printf("BAR4 is %#lx\n", bar4);

	return 0;
}